

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_NtkComputeLevelR(Acb_Ntk_t *p,Vec_Int_t *vTfi)

{
  int iVar1;
  int local_24;
  int Level;
  int iObj;
  int i;
  Vec_Int_t *vTfi_local;
  Acb_Ntk_t *p_local;
  
  local_24 = 0;
  iVar1 = Acb_NtkHasObjLevelR(p);
  if (iVar1 == 0) {
    Acb_NtkCleanObjLevelR(p);
  }
  Level = Vec_IntSize(vTfi);
  while (Level = Level + -1, -1 < Level) {
    iVar1 = Vec_IntEntry(vTfi,Level);
    Acb_ObjComputeLevelR(p,iVar1);
  }
  for (Level = 0; iVar1 = Acb_NtkCiNum(p), Level < iVar1; Level = Level + 1) {
    iVar1 = Acb_NtkCi(p,Level);
    iVar1 = Acb_ObjLevelR(p,iVar1);
    local_24 = Abc_MaxInt(local_24,iVar1);
  }
  p->LevelMax = local_24;
  return local_24;
}

Assistant:

int Acb_NtkComputeLevelR( Acb_Ntk_t * p, Vec_Int_t * vTfi )
{
    // it is assumed that vTfi contains CI nodes
    int i, iObj, Level = 0;
    if ( !Acb_NtkHasObjLevelR( p ) )
        Acb_NtkCleanObjLevelR( p );
    Vec_IntForEachEntryReverse( vTfi, iObj, i )
        Acb_ObjComputeLevelR( p, iObj );
    Acb_NtkForEachCi( p, iObj, i )
        Level = Abc_MaxInt( Level, Acb_ObjLevelR(p, iObj) );
//    assert( p->LevelMax == Level );
    p->LevelMax = Level;
    return Level;
}